

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

vector<interfaces::WalletAddress,_std::allocator<interfaces::WalletAddress>_> * __thiscall
wallet::anon_unknown_5::WalletImpl::getAddresses(WalletImpl *this)

{
  long lVar1;
  ListAddrBookFunc *in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  vector<interfaces::WalletAddress,_std::allocator<interfaces::WalletAddress>_> *result;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_std::optional<wallet::AddressPurpose>)>
  *in_stack_ffffffffffffff58;
  function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_std::optional<wallet::AddressPurpose>)>
  *this_00;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff98;
  ListAddrBookFunc *func;
  CWallet *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_std::optional<wallet::AddressPurpose>)>
             *)&(in_RSI->super__Function_base)._M_manager;
  func = in_RSI;
  this_01 = in_RDI;
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffff58);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,(int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  _GLOBAL__N_1::std::vector<interfaces::WalletAddress,_std::allocator<interfaces::WalletAddress>_>::
  vector((vector<interfaces::WalletAddress,_std::allocator<interfaces::WalletAddress>_> *)
         in_stack_ffffffffffffff58);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffff58);
  std::
  function<void(std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>const&,std::__cxx11::string_const&,bool,std::optional<wallet::AddressPurpose>)>
  ::
  function<wallet::(anonymous_namespace)::WalletImpl::getAddresses()::_lambda(std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>const&,std::__cxx11::string_const&,bool,std::optional<wallet::AddressPurpose>const&)_1_,void>
            (this_00,(anon_class_16_2_51289818 *)in_RDI);
  CWallet::ForEachAddrBookEntry(this_01,func);
  std::
  function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_std::optional<wallet::AddressPurpose>)>
  ::~function(in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<interfaces::WalletAddress,_std::allocator<interfaces::WalletAddress>_> *)in_RDI;
}

Assistant:

std::vector<WalletAddress> getAddresses() override
    {
        LOCK(m_wallet->cs_wallet);
        std::vector<WalletAddress> result;
        m_wallet->ForEachAddrBookEntry([&](const CTxDestination& dest, const std::string& label, bool is_change, const std::optional<AddressPurpose>& purpose) EXCLUSIVE_LOCKS_REQUIRED(m_wallet->cs_wallet) {
            if (is_change) return;
            isminetype is_mine = m_wallet->IsMine(dest);
            // In very old wallets, address purpose may not be recorded so we derive it from IsMine
            result.emplace_back(dest, is_mine, purpose.value_or(is_mine ? AddressPurpose::RECEIVE : AddressPurpose::SEND), label);
        });
        return result;
    }